

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

Node * __thiscall anon_unknown.dwarf_4161a3::Db::parseTemplateArg(Db *this)

{
  char cVar1;
  bool bVar2;
  size_t FromPosition;
  Node *Arg_2;
  NodeArray Args;
  Node *Arg_1;
  size_t ArgsBegin;
  Node *Arg;
  Db *this_local;
  
  cVar1 = look(this,0);
  if (cVar1 == 'J') {
    this->First = this->First + 1;
    FromPosition = PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::size(&this->Names);
    while (bVar2 = consumeIf(this,'E'), ((bVar2 ^ 0xffU) & 1) != 0) {
      Args.NumElements = (size_t)parseTemplateArg(this);
      if ((Node *)Args.NumElements == (Node *)0x0) {
        return (Node *)0x0;
      }
      PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back
                (&this->Names,(Node **)&Args.NumElements);
    }
    _Arg_2 = popTrailingNodeArray(this,FromPosition);
    this_local = (Db *)(anonymous_namespace)::Db::
                       make<(anonymous_namespace)::TemplateArgumentPack,(anonymous_namespace)::NodeArray&>
                                 ((Db *)this,(NodeArray *)&Arg_2);
  }
  else if (cVar1 == 'L') {
    cVar1 = look(this,1);
    if (cVar1 == 'Z') {
      this->First = this->First + 2;
      this_local = (Db *)parseEncoding(this);
      if ((this_local == (Db *)0x0) || (bVar2 = consumeIf(this,'E'), !bVar2)) {
        this_local = (Db *)0x0;
      }
    }
    else {
      this_local = (Db *)parseExprPrimary(this);
    }
  }
  else if (cVar1 == 'X') {
    this->First = this->First + 1;
    this_local = (Db *)parseExpr(this);
    if ((this_local == (Db *)0x0) || (bVar2 = consumeIf(this,'E'), !bVar2)) {
      this_local = (Db *)0x0;
    }
  }
  else {
    this_local = (Db *)parseType(this);
  }
  return (Node *)this_local;
}

Assistant:

Node *Db::parseTemplateArg() {
  switch (look()) {
  case 'X': {
    ++First;
    Node *Arg = parseExpr();
    if (Arg == nullptr || !consumeIf('E'))
      return nullptr;
    return Arg;
  }
  case 'J': {
    ++First;
    size_t ArgsBegin = Names.size();
    while (!consumeIf('E')) {
      Node *Arg = parseTemplateArg();
      if (Arg == nullptr)
        return nullptr;
      Names.push_back(Arg);
    }
    NodeArray Args = popTrailingNodeArray(ArgsBegin);
    return make<TemplateArgumentPack>(Args);
  }
  case 'L': {
    //                ::= LZ <encoding> E           # extension
    if (look(1) == 'Z') {
      First += 2;
      Node *Arg = parseEncoding();
      if (Arg == nullptr || !consumeIf('E'))
        return nullptr;
      return Arg;
    }
    //                ::= <expr-primary>            # simple expressions
    return parseExprPrimary();
  }
  default:
    return parseType();
  }
}